

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O0

void __thiscall
EnrichableSpiAnalyzer::AdvanceToActiveEnableEdgeWithCorrectClockPolarity
          (EnrichableSpiAnalyzer *this)

{
  bool bVar1;
  EnrichableSpiAnalyzer *this_local;
  
  std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::CommitPacketAndStartNewPacket();
  std::auto_ptr<EnrichableSpiAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::CommitResults();
  AdvanceToActiveEnableEdge(this);
  do {
    bVar1 = IsInitialClockPolarityCorrect(this);
  } while (!bVar1);
  return;
}

Assistant:

void EnrichableSpiAnalyzer::AdvanceToActiveEnableEdgeWithCorrectClockPolarity()
{
	mResults->CommitPacketAndStartNewPacket();
	mResults->CommitResults();
	
	AdvanceToActiveEnableEdge();

	for( ; ; )
	{
		if( IsInitialClockPolarityCorrect() == true )  //if false, this function moves to the next active enable edge.
			break;
	}
}